

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_epoll_ctl(int event_fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined8 uVar4;
  char *pcVar5;
  epoll_event event;
  char buf [512];
  
  event.events = 1;
  event.data.fd = event_fd;
  iVar1 = epoll_create1(0);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    __xpg_strerror_r(iVar1,buf,0x200);
    pcVar5 = "to created epoll";
    uVar4 = 0xd7;
  }
  else {
    iVar2 = epoll_ctl(iVar1,1,event_fd,(epoll_event *)&event);
    if (iVar2 != -1) {
      return iVar1;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    __xpg_strerror_r(iVar1,buf,0x200);
    pcVar5 = "to initialize epoll";
    uVar4 = 0xd9;
  }
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",uVar4
          ,"vfio_epoll_ctl",pcVar5,buf);
  exit(iVar1);
}

Assistant:

int vfio_epoll_ctl(int event_fd) {
	struct epoll_event event;
	event.events = EPOLLIN;
	event.data.fd = event_fd;

	int epoll_fd = (int) check_err(epoll_create1(0), "to created epoll");

	check_err(epoll_ctl(epoll_fd, EPOLL_CTL_ADD, event_fd, &event), "to initialize epoll");

	return epoll_fd;
}